

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O1

void __thiscall aalcalc::do_calc_end(aalcalc *this,int period_no)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_color _Var3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  pointer paVar7;
  pointer paVar8;
  pointer piVar9;
  pointer piVar10;
  pointer paVar11;
  pointer __s;
  pointer pdVar12;
  bool bVar13;
  _Rb_tree_color _Var14;
  _Rb_tree_color _Var15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  _Base_ptr p_Var18;
  int iVar19;
  int iVar20;
  _Base_ptr p_Var21;
  int *piVar22;
  long lVar23;
  long lVar24;
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  int local_94;
  double local_90;
  double local_88;
  double dStack_80;
  pointer local_70;
  ulong local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  _Rb_tree_node_base *local_40;
  long local_38;
  
  sVar6 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_94 = period_no;
  if (sVar6 == 0) {
    local_88 = 1.0;
    dStack_80 = 0.0;
  }
  else {
    p_Var1 = &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header;
    p_Var18 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var21 = &p_Var1->_M_header;
    for (; p_Var18 != (_Base_ptr)0x0;
        p_Var18 = (&p_Var18->_M_left)[(int)p_Var18[1]._M_color < period_no]) {
      if (period_no <= (int)p_Var18[1]._M_color) {
        p_Var21 = p_Var18;
      }
    }
    p_Var18 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var21 != p_Var1) &&
       (p_Var18 = p_Var21, period_no < (int)p_Var21[1]._M_color)) {
      p_Var18 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var18 == p_Var1) {
      local_88 = 0.0;
      dStack_80 = 0.0;
    }
    else {
      auVar25._8_4_ = (int)(sVar6 >> 0x20);
      auVar25._0_8_ = sVar6;
      auVar25._12_4_ = 0x45300000;
      dStack_80 = auVar25._8_8_ - 1.9342813113834067e+25;
      local_88 = dStack_80 + ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0);
      pmVar16 = std::
                map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                operator[](&this->periodstoweighting_,&local_94);
      local_88 = local_88 * *pmVar16;
    }
  }
  paVar7 = (this->vec_analytical_aal_).super__Vector_base<aal_rec,_std::allocator<aal_rec>_>._M_impl
           .super__Vector_impl_data._M_start;
  dVar29 = *(this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  iVar2 = this->current_summary_id_;
  paVar7[iVar2].type = 1;
  paVar7[iVar2].summary_id = iVar2;
  paVar7[iVar2].mean = dVar29 * local_88 + paVar7[iVar2].mean;
  paVar7[iVar2].mean_squared = dVar29 * dVar29 * local_88 + paVar7[iVar2].mean_squared;
  pmVar17 = std::
            map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
            ::operator[](&this->vec_sample_aal_,&this->samplesize_);
  iVar2 = this->current_summary_id_;
  paVar8 = (pmVar17->super__Vector_base<aal_rec_period,_std::allocator<aal_rec_period>_>)._M_impl.
           super__Vector_impl_data._M_start;
  paVar8[iVar2].super_aal_rec.type = 2;
  _Var3 = this->samplesize_;
  iVar4 = this->current_summary_id_;
  iVar20 = iVar4;
  if (_Var3 == _S_red) {
    iVar20 = 0;
  }
  paVar8[iVar2].super_aal_rec.summary_id = iVar20;
  if ((int)_Var3 < 1) {
    dVar29 = 0.0;
  }
  else {
    local_50 = (this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
    p_Var18 = (this->vec_sample_aal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_58 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_60 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_68 = (ulong)(uint)(this->max_ensemble_id_ * (iVar4 + -1));
    local_70 = (this->vec_ensemble_aal_).
               super__Vector_base<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>._M_impl.
               super__Vector_impl_data._M_start;
    dVar29 = 0.0;
    local_38 = (long)iVar4 << 5;
    dVar28 = local_88;
    _Var15 = _S_black;
    do {
      _Var14 = p_Var18[1]._M_color;
      if (_Var14 != _Var3) {
        local_48 = (this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        piVar9 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar10 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_90 = dVar29;
        do {
          piVar22 = (int *)((long)&(p_Var18[1]._M_parent)->_M_color + local_38);
          dVar29 = 0.0;
          _Var15 = _Var14;
          if (SBORROW4(_Var14,_Var14 * 2) != 0 < (int)_Var14) {
            iVar20 = this->max_ensemble_id_;
            paVar11 = (this->vec_ensemble_aal_).
                      super__Vector_base<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            lVar23 = (long)(int)_Var14;
            lVar24 = 0;
            do {
              dVar27 = local_48[lVar23 + lVar24];
              piVar22[1] = 2;
              *piVar22 = iVar4;
              dVar26 = dVar27 * dVar28;
              *(double *)(piVar22 + 2) = *(double *)(piVar22 + 2) + dVar26;
              paVar8[iVar2].super_aal_rec.mean = paVar8[iVar2].super_aal_rec.mean + dVar26;
              dVar27 = dVar27 * dVar27 * dVar28;
              *(double *)(piVar22 + 4) = *(double *)(piVar22 + 4) + dVar27;
              paVar8[iVar2].super_aal_rec.mean_squared =
                   paVar8[iVar2].super_aal_rec.mean_squared + dVar27;
              if (piVar10 != piVar9) {
                iVar5 = piVar9[lVar23 + lVar24];
                iVar19 = iVar20 * (iVar4 + -1) + iVar5;
                paVar11[iVar19].super_aal_rec.summary_id = iVar4;
                paVar11[iVar19].super_aal_rec.type = 2;
                paVar11[iVar19].ensemble_id = iVar5;
                paVar11[iVar19].super_aal_rec.mean = paVar11[iVar19].super_aal_rec.mean + dVar26;
                paVar11[iVar19].super_aal_rec.mean_squared =
                     dVar27 + paVar11[iVar19].super_aal_rec.mean_squared;
              }
              dVar29 = dVar29 + dVar26;
              local_90 = local_90 + dVar26;
              lVar24 = lVar24 + 1;
            } while ((int)(_Var14 * 2) - lVar23 != lVar24);
            _Var15 = _Var14 + (int)lVar24;
            local_40 = p_Var18;
          }
          *(double *)(piVar22 + 6) = dVar29 * dVar29 + *(double *)(piVar22 + 6);
          p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
          _Var14 = p_Var18[1]._M_color;
          dVar28 = local_88;
          dVar29 = local_90;
        } while (_Var14 != _Var3);
      }
      dVar27 = local_50[(int)_Var15];
      dVar26 = dVar27 * dVar28;
      paVar8[iVar2].super_aal_rec.mean = paVar8[iVar2].super_aal_rec.mean + dVar26;
      dVar27 = dVar27 * dVar27 * dVar28;
      paVar8[iVar2].super_aal_rec.mean_squared = paVar8[iVar2].super_aal_rec.mean_squared + dVar27;
      if (local_58 != local_60) {
        iVar20 = local_60[(int)_Var15];
        iVar19 = (int)local_68 + iVar20;
        local_70[iVar19].super_aal_rec.summary_id = iVar4;
        local_70[iVar19].super_aal_rec.type = 2;
        local_70[iVar19].ensemble_id = iVar20;
        local_70[iVar19].super_aal_rec.mean = local_70[iVar19].super_aal_rec.mean + dVar26;
        local_70[iVar19].super_aal_rec.mean_squared =
             dVar27 + local_70[iVar19].super_aal_rec.mean_squared;
      }
      dVar29 = dVar29 + dVar26;
      bVar13 = (int)_Var15 < (int)_Var3;
      _Var15 = _Var15 + _S_black;
    } while (bVar13);
  }
  paVar8[iVar2].mean_period = dVar29 * dVar29 + paVar8[iVar2].mean_period;
  __s = (this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar12 = (this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (__s != pdVar12) {
    memset(__s,0,((long)pdVar12 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  return;
}

Assistant:

void aalcalc::do_calc_end(const int period_no) {

	// Get weighting
	double weighting = 1;
	double factor = (double)periodstoweighting_.size();
	if (factor > 0) {
		if (periodstoweighting_.find(period_no) != periodstoweighting_.end()) {
			weighting = periodstoweighting_[period_no] * factor;
		} else {
			weighting = 0;
		}
	}

	// There is always an analytical mean
	double mean = vec_sample_sum_loss_[0];
	aal_rec& aa = vec_analytical_aal_[current_summary_id_];
	aa.type = 1;
	aa.summary_id = current_summary_id_;
	aa.mean += mean * weighting;
	aa.mean_squared += mean * mean * weighting;

	aal_rec_period& a_total = vec_sample_aal_[samplesize_][current_summary_id_];
	a_total.type = 2;
	a_total.summary_id = samplesize_ != 0 ? current_summary_id_ : 0;
	double total_mean_by_period = 0;
	auto iter = vec_sample_aal_.begin();
	for (int sidx = 1; sidx < samplesize_ + 1; sidx++) {
		while (iter->first != samplesize_) {
			aal_rec_period& a = iter->second[current_summary_id_];
			double mean_by_period = 0;
			for (sidx = iter->first; sidx < (iter->first << 1); sidx++)
			{
				mean = vec_sample_sum_loss_[sidx];
				a.type = 2;
				a.summary_id = current_summary_id_;
				mean_by_period += mean * weighting;
				a.mean += mean * weighting;
				total_mean_by_period += mean * weighting;
				a_total.mean += mean * weighting;
				a.mean_squared += mean * mean * weighting;
				a_total.mean_squared += mean * mean * weighting;
				if (sidxtoensemble_.size() > 0)
					fillensemblerec(sidx, mean, weighting);
			}
			a.mean_period += mean_by_period * mean_by_period;
			iter++;
		}
		mean = vec_sample_sum_loss_[sidx];
		total_mean_by_period += mean * weighting;
		a_total.mean += mean * weighting;
		a_total.mean_squared += mean * mean * weighting;
		if (sidxtoensemble_.size() > 0)
			fillensemblerec(sidx, mean, weighting);
	}
	a_total.mean_period += total_mean_by_period * total_mean_by_period;

	std::fill(vec_sample_sum_loss_.begin(), vec_sample_sum_loss_.end(), 0.0);

}